

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr valuePop(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathObjectPtr *ppxVar2;
  xmlXPathObjectPtr pxVar3;
  uint uVar4;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    iVar1 = ctxt->valueNr;
    if (0 < (long)iVar1) {
      if (ctxt->valueFrame < iVar1) {
        uVar4 = iVar1 - 1;
        ctxt->valueNr = uVar4;
        ppxVar2 = ctxt->valueTab;
        if (iVar1 == 1) {
          pxVar3 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar3 = ppxVar2[(long)iVar1 + -2];
        }
        ctxt->value = pxVar3;
        pxVar3 = ppxVar2[uVar4];
        ppxVar2[uVar4] = (xmlXPathObjectPtr)0x0;
        return pxVar3;
      }
      xmlXPathErr(ctxt,0x17);
      return (xmlXPathObjectPtr)0x0;
    }
  }
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

xmlXPathObjectPtr
valuePop(xmlXPathParserContextPtr ctxt)
{
    xmlXPathObjectPtr ret;

    if ((ctxt == NULL) || (ctxt->valueNr <= 0))
        return (NULL);

    if (ctxt->valueNr <= ctxt->valueFrame) {
        xmlXPatherror(ctxt, __FILE__, __LINE__, XPATH_STACK_ERROR);
        return (NULL);
    }

    ctxt->valueNr--;
    if (ctxt->valueNr > 0)
        ctxt->value = ctxt->valueTab[ctxt->valueNr - 1];
    else
        ctxt->value = NULL;
    ret = ctxt->valueTab[ctxt->valueNr];
    ctxt->valueTab[ctxt->valueNr] = NULL;
    return (ret);
}